

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::operator=
          (RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *this,
          ShaderResourceBindingVkImpl *pObj)

{
  RefCountedObject<Diligent::IShaderResourceBindingVk> *this_00;
  
  this_00 = (RefCountedObject<Diligent::IShaderResourceBindingVk> *)this->m_pObject;
  if (this_00 != (RefCountedObject<Diligent::IShaderResourceBindingVk> *)pObj) {
    if (this_00 != (RefCountedObject<Diligent::IShaderResourceBindingVk> *)0x0) {
      RefCountedObject<Diligent::IShaderResourceBindingVk>::Release(this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (ShaderResourceBindingVkImpl *)0x0) {
      RefCountedObject<Diligent::IShaderResourceBindingVk>::AddRef
                ((RefCountedObject<Diligent::IShaderResourceBindingVk> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }